

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cwksp *ws;
  uint *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  void *alloc;
  ulong uVar5;
  ZSTD_cwksp local_60;
  
  if (((ulong)workspace & 7) == 0 && 0x488 < workspaceSize) {
    local_60.workspaceEnd = (void *)((long)workspace + workspaceSize);
    local_60.phase = ZSTD_cwksp_alloc_objects;
    local_60.allocFailed = 0;
    local_60.workspace = workspace;
    local_60.objectEnd = workspace;
    local_60.tableEnd = workspace;
    local_60.tableValidEnd = workspace;
    local_60.allocStart = local_60.workspaceEnd;
    ZSTD_cwksp_assert_internal_consistency(&local_60);
    local_60.workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(&local_60);
    ZSTD_cwksp_assert_internal_consistency(&local_60);
    if ((0x487 < (long)workspaceSize) &&
       (local_60.objectEnd = (void *)((long)workspace + 0x488), workspace != (void *)0x0)) {
      local_60.tableEnd = local_60.objectEnd;
      local_60.tableValidEnd = local_60.objectEnd;
      memset(workspace,0,0x488);
      *(void **)((long)workspace + 0x158) = local_60.tableValidEnd;
      *(void **)((long)workspace + 0x160) = local_60.allocStart;
      *(ulong *)((long)workspace + 0x168) =
           CONCAT44(local_60.workspaceOversizedDuration,local_60.allocFailed);
      *(ulong *)((long)workspace + 0x170) = CONCAT44(local_60._60_4_,local_60.phase);
      *(void **)((long)workspace + 0x138) = local_60.workspace;
      *(void **)((long)workspace + 0x140) = local_60.workspaceEnd;
      *(void **)((long)workspace + 0x148) = local_60.objectEnd;
      *(void **)((long)workspace + 0x150) = local_60.tableEnd;
      *(size_t *)((long)workspace + 0x208) = workspaceSize;
      if (0x3bdf < (ulong)(*(long *)((long)workspace + 0x160) - *(long *)((long)workspace + 0x150)))
      {
        uVar4 = *(ulong *)((long)workspace + 0x148);
        if ((uVar4 & 7) == 0) {
          ws = (ZSTD_cwksp *)((long)workspace + 0x138);
          ZSTD_cwksp_assert_internal_consistency(ws);
          if ((*(int *)((long)workspace + 0x170) == 0) &&
             (uVar5 = uVar4 + 0x11f0, uVar5 <= *(ulong *)((long)workspace + 0x140))) {
            *(ulong *)((long)workspace + 0x148) = uVar5;
            *(ulong *)((long)workspace + 0x150) = uVar5;
            *(ulong *)((long)workspace + 0x158) = uVar5;
          }
          else {
            *(undefined4 *)((long)workspace + 0x168) = 1;
            uVar5 = *(ulong *)((long)workspace + 0x148);
            uVar4 = 0;
          }
          *(ulong *)((long)workspace + 0x2f8) = uVar4;
          if ((uVar5 & 7) == 0) {
            ZSTD_cwksp_assert_internal_consistency(ws);
            if ((*(int *)((long)workspace + 0x170) == 0) &&
               (uVar4 = uVar5 + 0x11f0, uVar4 <= *(ulong *)((long)workspace + 0x140))) {
              *(ulong *)((long)workspace + 0x148) = uVar4;
              *(ulong *)((long)workspace + 0x150) = uVar4;
              *(ulong *)((long)workspace + 0x158) = uVar4;
            }
            else {
              *(undefined4 *)((long)workspace + 0x168) = 1;
              uVar4 = *(ulong *)((long)workspace + 0x148);
              uVar5 = 0;
            }
            *(ulong *)((long)workspace + 0x300) = uVar5;
            if ((uVar4 & 7) == 0) {
              ZSTD_cwksp_assert_internal_consistency(ws);
              if ((*(int *)((long)workspace + 0x170) == 0) &&
                 (uVar5 = uVar4 + 0x1800, uVar5 <= *(ulong *)((long)workspace + 0x140))) {
                *(ulong *)((long)workspace + 0x148) = uVar5;
                *(ulong *)((long)workspace + 0x150) = uVar5;
                *(ulong *)((long)workspace + 0x158) = uVar5;
              }
              else {
                *(undefined4 *)((long)workspace + 0x168) = 1;
                uVar4 = 0;
              }
              *(ulong *)((long)workspace + 0x3e0) = uVar4;
              puVar1 = (uint *)cpuid_basic_info(0);
              uVar3 = 0;
              if ((*puVar1 != 0) && (uVar3 = 0, 6 < *puVar1)) {
                lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
                uVar3 = *(uint *)(lVar2 + 4) >> 8 & 1;
              }
              *(uint *)((long)workspace + 8) = uVar3;
              return (ZSTD_CCtx *)workspace;
            }
          }
        }
        __assert_fail("((size_t)alloc & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1d30,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
      }
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) {
        return NULL;
    }
    memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, HUF_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(
        &cctx->workspace, HUF_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}